

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_frommesh.cpp
# Opt level: O0

ON_MeshNGonEdge *
ON_MeshNGonEdge::Create
          (ON_MeshNGonEdge *__return_storage_ptr__,uint candidate_sud_face_id,uint mesh_Vi,
          uint mesh_Vj,uint *mesh_point_id)

{
  uint uVar1;
  uint uVar2;
  uchar uVar3;
  undefined3 uVar4;
  uint b;
  uint a;
  uint *mesh_point_id_local;
  uint mesh_Vj_local;
  uint mesh_Vi_local;
  uint candidate_sud_face_id_local;
  
  if ((candidate_sud_face_id == 0) || (mesh_Vi == mesh_Vj)) {
LAB_008e5277:
    ON_SubDIncrementErrorCount();
    uVar1 = Unset.m_mesh_Vi;
    __return_storage_ptr__->m_sud_face_id = Unset.m_sud_face_id;
    __return_storage_ptr__->m_mesh_Vi = uVar1;
    uVar3 = Unset.m_u_status;
    uVar4 = Unset._13_3_;
    __return_storage_ptr__->m_mesh_Vj = Unset.m_mesh_Vj;
    __return_storage_ptr__->m_u_status = uVar3;
    *(undefined3 *)&__return_storage_ptr__->field_0xd = uVar4;
    __return_storage_ptr__->m_u = Unset.m_u;
  }
  else {
    uVar1 = Unset.m_mesh_Vi;
    __return_storage_ptr__->m_sud_face_id = Unset.m_sud_face_id;
    __return_storage_ptr__->m_mesh_Vi = uVar1;
    uVar3 = Unset.m_u_status;
    uVar4 = Unset._13_3_;
    __return_storage_ptr__->m_mesh_Vj = Unset.m_mesh_Vj;
    __return_storage_ptr__->m_u_status = uVar3;
    *(undefined3 *)&__return_storage_ptr__->field_0xd = uVar4;
    __return_storage_ptr__->m_u = Unset.m_u;
    uVar1 = mesh_point_id[mesh_Vi];
    uVar2 = mesh_point_id[mesh_Vj];
    if (uVar1 < uVar2) {
      (__return_storage_ptr__->m_u).mesh_edge_topology_id.i = uVar1;
      (__return_storage_ptr__->m_u).mesh_edge_topology_id.j = uVar2;
      __return_storage_ptr__->m_u_status = '\x01';
    }
    else {
      if (uVar1 <= uVar2) goto LAB_008e5277;
      (__return_storage_ptr__->m_u).mesh_edge_topology_id.i = uVar2;
      (__return_storage_ptr__->m_u).mesh_edge_topology_id.j = uVar1;
      __return_storage_ptr__->m_u_status = '\x01';
    }
    __return_storage_ptr__->m_mesh_Vi = mesh_Vi;
    __return_storage_ptr__->m_mesh_Vj = mesh_Vj;
    __return_storage_ptr__->m_sud_face_id = candidate_sud_face_id;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_MeshNGonEdge ON_MeshNGonEdge::Create(
  unsigned candidate_sud_face_id,
  unsigned mesh_Vi,
  unsigned mesh_Vj,
  const unsigned int* mesh_point_id
)
{
  for(;;)
  {
    if (candidate_sud_face_id <= 0)
      break;
    if (mesh_Vi == mesh_Vj)
      break;
    ON_MeshNGonEdge e = ON_MeshNGonEdge::Unset;
    const unsigned a = mesh_point_id[mesh_Vi];
    const unsigned b = mesh_point_id[mesh_Vj];
    if (a < b)
    {
      e.m_u.mesh_edge_topology_id.i = a;
      e.m_u.mesh_edge_topology_id.j = b;
      e.m_u_status = 1;
    }
    else if (a > b)
    {
      e.m_u.mesh_edge_topology_id.i = b;
      e.m_u.mesh_edge_topology_id.j = a;
      e.m_u_status = 1;
    }
    else
      break;
    e.m_mesh_Vi = mesh_Vi;
    e.m_mesh_Vj = mesh_Vj;
    e.m_sud_face_id = candidate_sud_face_id;
    return e;
  }
  return ON_SUBD_RETURN_ERROR(ON_MeshNGonEdge::Unset);
}